

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntWeakPtr<Diligent::TopLevelASVkImpl> * __thiscall
Diligent::RefCntWeakPtr<Diligent::TopLevelASVkImpl>::operator=
          (RefCntWeakPtr<Diligent::TopLevelASVkImpl> *this,
          RefCntWeakPtr<Diligent::TopLevelASVkImpl> *WeakPtr)

{
  if (this->m_pRefCounters != WeakPtr->m_pRefCounters) {
    Release(this);
    this->m_pObject = WeakPtr->m_pObject;
    this->m_pRefCounters = WeakPtr->m_pRefCounters;
    WeakPtr->m_pRefCounters = (RefCountersImpl *)0x0;
    WeakPtr->m_pObject = (TopLevelASVkImpl *)0x0;
  }
  return this;
}

Assistant:

RefCntWeakPtr& operator=(RefCntWeakPtr&& WeakPtr) noexcept
    {
        if (*this == WeakPtr)
            return *this;

        Release();
        m_pObject              = std::move(WeakPtr.m_pObject);
        m_pRefCounters         = std::move(WeakPtr.m_pRefCounters);
        WeakPtr.m_pRefCounters = nullptr;
        WeakPtr.m_pObject      = nullptr;
        return *this;
    }